

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_aos_to_soa.c
# Opt level: O3

void trico_transpose_uint64_aos_to_soa
               (uint8_t **b1,uint8_t **b2,uint8_t **b3,uint8_t **b4,uint8_t **b5,uint8_t **b6,
               uint8_t **b7,uint8_t **b8,uint64_t *indices,uint32_t nr_of_indices)

{
  uint64_t uVar1;
  ulong uVar2;
  
  if (nr_of_indices != 0) {
    uVar2 = 0;
    do {
      uVar1 = indices[uVar2];
      (*b1)[uVar2] = (uint8_t)uVar1;
      (*b2)[uVar2] = (uint8_t)(uVar1 >> 8);
      (*b3)[uVar2] = (uint8_t)(uVar1 >> 0x10);
      (*b4)[uVar2] = (uint8_t)(uVar1 >> 0x18);
      (*b5)[uVar2] = (uint8_t)(uVar1 >> 0x20);
      (*b6)[uVar2] = (uint8_t)(uVar1 >> 0x28);
      (*b7)[uVar2] = (uint8_t)(uVar1 >> 0x30);
      (*b8)[uVar2] = (uint8_t)(uVar1 >> 0x38);
      uVar2 = uVar2 + 1;
    } while (nr_of_indices != uVar2);
  }
  return;
}

Assistant:

void trico_transpose_uint64_aos_to_soa(uint8_t** b1, uint8_t** b2, uint8_t** b3, uint8_t** b4, uint8_t** b5, uint8_t** b6, uint8_t** b7, uint8_t** b8, const uint64_t* indices, uint32_t nr_of_indices)
  {
  for (uint32_t i = 0; i < nr_of_indices; ++i)
    {
    const uint64_t index = *indices++;
    (*b1)[i] = index & 0xff;
    (*b2)[i] = (index >> 8) & 0xff;
    (*b3)[i] = (index >> 16) & 0xff;
    (*b4)[i] = (index >> 24) & 0xff;
    (*b5)[i] = (index >> 32) & 0xff;
    (*b6)[i] = (index >> 40) & 0xff;
    (*b7)[i] = (index >> 48) & 0xff;
    (*b8)[i] = (index >> 56) & 0xff;
    }
  }